

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O0

void __thiscall QDebugStateSaver::~QDebugStateSaver(QDebugStateSaver *this)

{
  unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_> *in_RDI;
  QDebugStateSaverPrivate *unaff_retaddr;
  
  std::unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>::
  operator->((unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_> *)
             0x27982c);
  QDebugStateSaverPrivate::restoreState(unaff_retaddr);
  std::unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>::
  ~unique_ptr(in_RDI);
  return;
}

Assistant:

QDebugStateSaver::~QDebugStateSaver()
{
    d->restoreState();
}